

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void state_texops(Context *ctx,char *opcode,int dims,int texbem)

{
  TextureType ttype;
  TextureType ttyp;
  SourceArgInfo *src;
  DestArgInfo *dst;
  int texbem_local;
  int dims_local;
  char *opcode_local;
  Context *ctx_local;
  
  if ((ctx->dest_arg).regtype != REG_TYPE_ADDRESS) {
    failf(ctx,"%s destination must be a texture register",opcode);
  }
  if (ctx->source_args[0].regtype != REG_TYPE_ADDRESS) {
    failf(ctx,"%s source must be a texture register",opcode);
  }
  if ((ctx->dest_arg).regnum <= ctx->source_args[0].regnum) {
    failf(ctx,"%s dest must be a higher register than source",opcode);
  }
  if (dims != 0) {
    ttype = TEXTURE_TYPE_CUBE;
    if (dims == 2) {
      ttype = TEXTURE_TYPE_2D;
    }
    add_sampler(ctx,(ctx->dest_arg).regnum,ttype,texbem);
  }
  add_attribute_register
            (ctx,REG_TYPE_ADDRESS,(ctx->dest_arg).regnum,MOJOSHADER_USAGE_TEXCOORD,
             (ctx->dest_arg).regnum,0xf,0);
  add_attribute_register
            (ctx,REG_TYPE_ADDRESS,ctx->source_args[0].regnum,MOJOSHADER_USAGE_TEXCOORD,
             ctx->source_args[0].regnum,0xf,0);
  return;
}

Assistant:

static void state_texops(Context *ctx, const char *opcode,
                         const int dims, const int texbem)
{
    const DestArgInfo *dst = &ctx->dest_arg;
    const SourceArgInfo *src = &ctx->source_args[0];
    if (dst->regtype != REG_TYPE_TEXTURE)
        failf(ctx, "%s destination must be a texture register", opcode);
    if (src->regtype != REG_TYPE_TEXTURE)
        failf(ctx, "%s source must be a texture register", opcode);
    if (src->regnum >= dst->regnum)  // so says MSDN.
        failf(ctx, "%s dest must be a higher register than source", opcode);

    if (dims)
    {
        TextureType ttyp = (dims == 2) ? TEXTURE_TYPE_2D : TEXTURE_TYPE_CUBE;
        add_sampler(ctx, dst->regnum, ttyp, texbem);
    } // if

    add_attribute_register(ctx, REG_TYPE_TEXTURE, dst->regnum,
                           MOJOSHADER_USAGE_TEXCOORD, dst->regnum, 0xF, 0);

    // Strictly speaking, there should be a TEX opcode prior to this call that
    //  should fill in this metadata, but I'm not sure that's required for the
    //  shader to assemble in D3D, so we'll do this so we don't fail with a
    //  cryptic error message even if the developer didn't do the TEX.
    add_attribute_register(ctx, REG_TYPE_TEXTURE, src->regnum,
                           MOJOSHADER_USAGE_TEXCOORD, src->regnum, 0xF, 0);
}